

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcTransportElement::~IfcTransportElement(IfcTransportElement *this)

{
  IfcElement *this_00;
  long *plVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject + -0x18);
  this_00 = (IfcElement *)
            (&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x0 + lVar2);
  plVar1 = (long *)(&this->field_0x158 + lVar2);
  plVar1[-0x2b] = 0x8cc340;
  plVar1[7] = 0x8cc430;
  plVar1[-0x1a] = 0x8cc368;
  plVar1[-0x18] = 0x8cc390;
  plVar1[-0x11] = 0x8cc3b8;
  plVar1[-0xb] = 0x8cc3e0;
  plVar1[-4] = 0x8cc408;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  IfcElement::~IfcElement(this_00,&PTR_construction_vtable_24__008cc448);
  operator_delete(this_00,0x1a8);
  return;
}

Assistant:

IfcTransportElement() : Object("IfcTransportElement") {}